

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_index_module.c
# Opt level: O0

ngx_int_t ngx_http_index_handler(ngx_http_request_t *r)

{
  long *plVar1;
  ngx_http_core_loc_conf_t *clcf_00;
  bool bVar2;
  ngx_int_t nVar3;
  long lVar4;
  void *__dest;
  ngx_http_script_len_code_pt lcode;
  ngx_http_index_loc_conf_t *ilcf;
  ngx_http_core_loc_conf_t *clcf;
  ngx_http_script_engine_t e;
  ngx_http_script_code_pt code;
  ngx_open_file_info_t of;
  ngx_http_index_t *index;
  ngx_uint_t dir_tested;
  ngx_uint_t i;
  ngx_str_t uri;
  ngx_str_t path;
  ngx_int_t rc;
  size_t allocated;
  size_t reserve;
  size_t root;
  size_t len;
  u_char *name;
  u_char *p;
  ngx_http_request_t *r_local;
  
  if (((r->uri).data[(r->uri).len - 1] == '/') && ((r->method & 0xe) != 0)) {
    plVar1 = (long *)r->loc_conf[ngx_http_index_module.ctx_index];
    clcf_00 = (ngx_http_core_loc_conf_t *)r->loc_conf[ngx_http_core_module.ctx_index];
    rc = 0;
    reserve = 0;
    bVar2 = false;
    len = 0;
    of._96_8_ = *(undefined8 *)*plVar1;
    p = (u_char *)r;
    for (dir_tested = 0; dir_tested < *(ulong *)(*plVar1 + 8); dir_tested = dir_tested + 1) {
      if (*(long *)(of._96_8_ + dir_tested * 0x20 + 0x10) == 0) {
        if (**(char **)(of._96_8_ + dir_tested * 0x20 + 8) == '/') {
          nVar3 = ngx_http_internal_redirect
                            ((ngx_http_request_t *)p,(ngx_str_t *)(of._96_8_ + dir_tested * 0x20),
                             (ngx_str_t *)(p + 0x360));
          return nVar3;
        }
        allocated = plVar1[1];
        root = *(size_t *)(of._96_8_ + dir_tested * 0x20);
      }
      else {
        memset(&clcf,0,0x58);
        clcf = (ngx_http_core_loc_conf_t *)**(undefined8 **)(of._96_8_ + dir_tested * 0x20 + 0x10);
        e.status = (ngx_int_t)p;
        e.args._0_1_ = (byte)e.args & 0xfe | 1;
        root = 1;
        while ((clcf->name).len != 0) {
          lVar4 = (*(code *)(clcf->name).len)(&clcf);
          root = lVar4 + root;
        }
        allocated = root + 0x10;
      }
      if ((ulong)rc < allocated) {
        len = (size_t)ngx_http_map_uri_to_path
                                ((ngx_http_request_t *)p,(ngx_str_t *)&uri.data,&reserve,allocated);
        if ((u_char *)len == (u_char *)0x0) {
          return -1;
        }
        rc = (long)uri.data - len;
      }
      if (*(long *)(of._96_8_ + dir_tested * 0x20 + 0x18) == 0) {
        memcpy((void *)len,*(void **)(of._96_8_ + dir_tested * 0x20 + 8),
               *(size_t *)(of._96_8_ + dir_tested * 0x20));
        uri.data = (u_char *)(len + *(long *)(of._96_8_ + dir_tested * 0x20) + -1);
      }
      else {
        clcf = (ngx_http_core_loc_conf_t *)**(undefined8 **)(of._96_8_ + dir_tested * 0x20 + 0x18);
        e.ip = (u_char *)len;
        while ((clcf->name).len != 0) {
          e.request = (ngx_http_request_t *)(clcf->name).len;
          (*(code *)e.request)(&clcf);
        }
        if (*(char *)len == '/') {
          i = root - 1;
          uri.len = len;
          nVar3 = ngx_http_internal_redirect
                            ((ngx_http_request_t *)p,(ngx_str_t *)&i,(ngx_str_t *)(p + 0x360));
          return nVar3;
        }
        *e.ip = '\0';
        uri.data = e.ip;
      }
      if ((**(ulong **)(*(long *)(p + 8) + 0x50) & 0x100) != 0) {
        ngx_log_error_core(8,*(ngx_log_t **)(*(long *)(p + 8) + 0x50),0,"open index \"%V\"",
                           &uri.data);
      }
      memset(&code,0,0x68);
      of.directio = clcf_00->read_ahead;
      of.fs_size = clcf_00->directio;
      of.failed = (char *)clcf_00->open_file_cache_valid;
      of.valid = clcf_00->open_file_cache_min_uses;
      of.disable_symlinks_from._0_2_ =
           (ushort)of.disable_symlinks_from & 0xff97 | 8 |
           ((ushort)clcf_00->open_file_cache_errors & 1) << 5 |
           ((ushort)clcf_00->open_file_cache_events & 1) << 6;
      nVar3 = ngx_http_set_disable_symlinks
                        ((ngx_http_request_t *)p,clcf_00,(ngx_str_t *)&uri.data,
                         (ngx_open_file_info_t *)&code);
      if (nVar3 != 0) {
        return 500;
      }
      nVar3 = ngx_open_cached_file
                        (clcf_00->open_file_cache,(ngx_str_t *)&uri.data,
                         (ngx_open_file_info_t *)&code,*(ngx_pool_t **)(p + 0x58));
      if (nVar3 == 0) {
        i = (*(long *)(p + 0x350) + root) - 1;
        if (clcf_00->alias == 0) {
          uri.len = reserve;
        }
        else {
          __dest = ngx_pnalloc(*(ngx_pool_t **)(p + 0x58),i);
          if (__dest == (void *)0x0) {
            return 500;
          }
          uri.len = (size_t)__dest;
          memcpy(__dest,*(void **)(p + 0x358),*(size_t *)(p + 0x350));
          name = (u_char *)((long)__dest + *(long *)(p + 0x350));
          memcpy(name,(void *)len,root - 1);
        }
        nVar3 = ngx_http_internal_redirect
                          ((ngx_http_request_t *)p,(ngx_str_t *)&i,(ngx_str_t *)(p + 0x360));
        return nVar3;
      }
      if ((int)of.read_ahead == 0) {
        return 500;
      }
      if ((**(ulong **)(*(long *)(p + 8) + 0x50) & 0x100) != 0) {
        ngx_log_error_core(8,*(ngx_log_t **)(*(long *)(p + 8) + 0x50),(int)of.read_ahead,
                           "%s \"%s\" failed",of._56_8_,0);
      }
      if (((int)of.read_ahead == 0x1f) || ((int)of.read_ahead == 0x28)) {
        return 0x193;
      }
      if ((((int)of.read_ahead == 0x14) || ((int)of.read_ahead == 0x24)) ||
         ((int)of.read_ahead == 0xd)) {
        nVar3 = ngx_http_index_error
                          ((ngx_http_request_t *)p,clcf_00,(u_char *)0x0,(int)of.read_ahead);
        return nVar3;
      }
      if (!bVar2) {
        nVar3 = ngx_http_index_test_dir
                          ((ngx_http_request_t *)p,clcf_00,(u_char *)0x0,(u_char *)(len - 1));
        if (nVar3 != 0) {
          return nVar3;
        }
        bVar2 = true;
      }
      if ((int)of.read_ahead != 2) {
        if (2 < **(ulong **)(*(long *)(p + 8) + 0x50)) {
          ngx_log_error_core(3,*(ngx_log_t **)(*(long *)(p + 8) + 0x50),(int)of.read_ahead,
                             "%s \"%s\" failed",of._56_8_,0);
        }
        return 500;
      }
    }
  }
  return -5;
}

Assistant:

static ngx_int_t
ngx_http_index_handler(ngx_http_request_t *r)
{
    u_char                       *p, *name;
    size_t                        len, root, reserve, allocated;
    ngx_int_t                     rc;
    ngx_str_t                     path, uri;
    ngx_uint_t                    i, dir_tested;
    ngx_http_index_t             *index;
    ngx_open_file_info_t          of;
    ngx_http_script_code_pt       code;
    ngx_http_script_engine_t      e;
    ngx_http_core_loc_conf_t     *clcf;
    ngx_http_index_loc_conf_t    *ilcf;
    ngx_http_script_len_code_pt   lcode;

    if (r->uri.data[r->uri.len - 1] != '/') {
        return NGX_DECLINED;
    }

    if (!(r->method & (NGX_HTTP_GET|NGX_HTTP_HEAD|NGX_HTTP_POST))) {
        return NGX_DECLINED;
    }

    ilcf = ngx_http_get_module_loc_conf(r, ngx_http_index_module);
    clcf = ngx_http_get_module_loc_conf(r, ngx_http_core_module);

    allocated = 0;
    root = 0;
    dir_tested = 0;
    name = NULL;
    /* suppress MSVC warning */
    path.data = NULL;

    index = ilcf->indices->elts;
    for (i = 0; i < ilcf->indices->nelts; i++) {

        if (index[i].lengths == NULL) {

            if (index[i].name.data[0] == '/') {
                return ngx_http_internal_redirect(r, &index[i].name, &r->args);
            }

            reserve = ilcf->max_index_len;
            len = index[i].name.len;

        } else {
            ngx_memzero(&e, sizeof(ngx_http_script_engine_t));

            e.ip = index[i].lengths->elts;
            e.request = r;
            e.flushed = 1;

            /* 1 is for terminating '\0' as in static names */
            len = 1;

            while (*(uintptr_t *) e.ip) {
                lcode = *(ngx_http_script_len_code_pt *) e.ip;
                len += lcode(&e);
            }

            /* 16 bytes are preallocation */

            reserve = len + 16;
        }

        if (reserve > allocated) {

            name = ngx_http_map_uri_to_path(r, &path, &root, reserve);
            if (name == NULL) {
                return NGX_ERROR;
            }

            allocated = path.data + path.len - name;
        }

        if (index[i].values == NULL) {

            /* index[i].name.len includes the terminating '\0' */

            ngx_memcpy(name, index[i].name.data, index[i].name.len);

            path.len = (name + index[i].name.len - 1) - path.data;

        } else {
            e.ip = index[i].values->elts;
            e.pos = name;

            while (*(uintptr_t *) e.ip) {
                code = *(ngx_http_script_code_pt *) e.ip;
                code((ngx_http_script_engine_t *) &e);
            }

            if (*name == '/') {
                uri.len = len - 1;
                uri.data = name;
                return ngx_http_internal_redirect(r, &uri, &r->args);
            }

            path.len = e.pos - path.data;

            *e.pos = '\0';
        }

        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "open index \"%V\"", &path);

        ngx_memzero(&of, sizeof(ngx_open_file_info_t));

        of.read_ahead = clcf->read_ahead;
        of.directio = clcf->directio;
        of.valid = clcf->open_file_cache_valid;
        of.min_uses = clcf->open_file_cache_min_uses;
        of.test_only = 1;
        of.errors = clcf->open_file_cache_errors;
        of.events = clcf->open_file_cache_events;

        if (ngx_http_set_disable_symlinks(r, clcf, &path, &of) != NGX_OK) {
            return NGX_HTTP_INTERNAL_SERVER_ERROR;
        }

        if (ngx_open_cached_file(clcf->open_file_cache, &path, &of, r->pool)
            != NGX_OK)
        {
            if (of.err == 0) {
                return NGX_HTTP_INTERNAL_SERVER_ERROR;
            }

            ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, of.err,
                           "%s \"%s\" failed", of.failed, path.data);

#if (NGX_HAVE_OPENAT)
            if (of.err == NGX_EMLINK
                || of.err == NGX_ELOOP)
            {
                return NGX_HTTP_FORBIDDEN;
            }
#endif

            if (of.err == NGX_ENOTDIR
                || of.err == NGX_ENAMETOOLONG
                || of.err == NGX_EACCES)
            {
                return ngx_http_index_error(r, clcf, path.data, of.err);
            }

            if (!dir_tested) {
                rc = ngx_http_index_test_dir(r, clcf, path.data, name - 1);

                if (rc != NGX_OK) {
                    return rc;
                }

                dir_tested = 1;
            }

            if (of.err == NGX_ENOENT) {
                continue;
            }

            ngx_log_error(NGX_LOG_CRIT, r->connection->log, of.err,
                          "%s \"%s\" failed", of.failed, path.data);

            return NGX_HTTP_INTERNAL_SERVER_ERROR;
        }

        uri.len = r->uri.len + len - 1;

        if (!clcf->alias) {
            uri.data = path.data + root;

        } else {
            uri.data = ngx_pnalloc(r->pool, uri.len);
            if (uri.data == NULL) {
                return NGX_HTTP_INTERNAL_SERVER_ERROR;
            }

            p = ngx_copy(uri.data, r->uri.data, r->uri.len);
            ngx_memcpy(p, name, len - 1);
        }

        return ngx_http_internal_redirect(r, &uri, &r->args);
    }

    return NGX_DECLINED;
}